

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O2

void __thiscall
sjtu::FileManager<sjtu::userType>::FileManager
          (FileManager<sjtu::userType> *this,string *filepath,uint cache_size)

{
  string asStack_38 [32];
  
  FileManager_Base<sjtu::userType>::FileManager_Base(&this->super_FileManager_Base<sjtu::userType>);
  (this->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base =
       (_func_int **)&PTR_init_0011d918;
  (this->super_FileManager_Base<sjtu::userType>).cache = (LRUCache<sjtu::userType> *)0x0;
  std::__cxx11::string::string(asStack_38,(string *)filepath);
  (**(this->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base)
            (this,asStack_38,(ulong)cache_size,0);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

FileManager(std::string filepath , unsigned int cache_size) {cache = nullptr , init(filepath , cache_size);}